

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_charset_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  byte *pbVar1;
  int iVar2;
  
  pbVar1 = (byte *)(state->cur_)._M_current;
  if (pbVar1 == (byte *)(state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else if (*this != (posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                     )((*(ushort *)(this + 2) &
                       *(ushort *)
                        ((long)&(state->context_).traits_[1]._vptr_traits + (ulong)*pbVar1 * 2)) !=
                      0)) {
    (state->cur_)._M_current = (char *)(pbVar1 + 1);
    iVar2 = (*(next->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[2])(next,state);
    if ((char)iVar2 != '\0') {
      return true;
    }
    (state->cur_)._M_current = (state->cur_)._M_current + -1;
  }
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || this->not_ == traits_cast<Traits>(state).isctype(
                *state.cur_, this->mask_))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }